

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree.hpp
# Opt level: O3

bool __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::
Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>
::hasNext(Iterator<Indexing::RetrievalAlgorithms::UnificationWithAbstraction<Kernel::AbstractingUnifier,_Indexing::RetrievalAlgorithms::VarBanksN<0U>_>_>
          *this)

{
  long *plVar1;
  BacktrackObject *pBVar2;
  BacktrackObject *pBVar3;
  char cVar4;
  bool bVar5;
  undefined1 uVar6;
  
  if (this->_normalizationRecording == true) {
    plVar1 = (long *)((long)(this->_algo)._unif._subs._self._M_t.
                            super___uniq_ptr_impl<Kernel::RobSubstitution,_std::default_delete<Kernel::RobSubstitution>_>
                            ._M_t + 0x10);
    *plVar1 = *plVar1 + -8;
    this->_normalizationRecording = false;
    pBVar3 = (this->_normalizationBacktrackData)._boList;
    while (pBVar3 != (BacktrackObject *)0x0) {
      (*pBVar3->_vptr_BacktrackObject[2])(pBVar3);
      pBVar2 = pBVar3->_next;
      (*pBVar3->_vptr_BacktrackObject[1])(pBVar3);
      pBVar3 = pBVar2;
    }
    (this->_normalizationBacktrackData)._boList = (BacktrackObject *)0x0;
  }
  do {
    if (((this->_leafData).
         super_OptionBase<Lib::VirtualIterator<Inferences::ALASCA::Demodulation::Lhs_*>_>._isSome ==
         true) &&
       (cVar4 = (**(code **)(*(long *)(this->_leafData).
                                      super_OptionBase<Lib::VirtualIterator<Inferences::ALASCA::Demodulation::Lhs_*>_>
                                      ._elem._elem + 0x10))(), cVar4 != '\0')) break;
    bVar5 = findNextLeaf(this);
  } while (bVar5);
  if ((this->_leafData).
      super_OptionBase<Lib::VirtualIterator<Inferences::ALASCA::Demodulation::Lhs_*>_>._isSome !=
      true) {
    return false;
  }
  uVar6 = (**(code **)(*(long *)(this->_leafData).
                                super_OptionBase<Lib::VirtualIterator<Inferences::ALASCA::Demodulation::Lhs_*>_>
                                ._elem._elem + 0x10))();
  return (bool)uVar6;
}

Assistant:

bool hasNext()
      {
        if(_normalizationRecording) {
          _algo.bdDone();
          _normalizationRecording=false;
          _normalizationBacktrackData.backtrack();
        }

        while(!hasLeafData() && findNextLeaf()) {}
        return hasLeafData();
      }